

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.hpp
# Opt level: O0

void __thiscall
re::beatnik::viterbi<float,_256L>::calculate_transition
          (viterbi<float,_256L> *this,span<const_float,_256L> input)

{
  float fVar1;
  reference pfVar2;
  reference pvVar3;
  pair<long,_float> pVar4;
  pair<long,_float> max_el;
  int_t m;
  undefined1 local_238 [4];
  int i;
  array<float,_128UL> temp;
  iterator input_it;
  iterator psi_it;
  iterator delta_it;
  viterbi<float,_256L> *this_local;
  span<const_float,_256L> input_local;
  
  psi_it = (iterator)::std::begin<std::array<float,256ul>>(&this->delta);
  input_it.index_ = (ptrdiff_t)::std::begin<std::array<long,256ul>>(&this->psi);
  ::std::cbegin<gsl::span<float_const,256l>>((span<const_float,_256L> *)(temp._M_elems + 0x7e));
  for (m._4_4_ = 0; m._4_4_ < 0x180; m._4_4_ = m._4_4_ + 1) {
    if (0x7f < m._4_4_) {
      gsl::details::span_iterator<gsl::span<const_float,_256L>,_false>::operator++
                ((span_iterator<gsl::span<const_float,_256L>,_false> *)&max_el.second,
                 (int)&temp + 0x1f8);
      pfVar2 = gsl::details::span_iterator<gsl::span<const_float,_256L>,_false>::operator*
                         ((span_iterator<gsl::span<const_float,_256L>,_false> *)&max_el.second);
      fVar1 = *pfVar2;
      pvVar3 = std::array<float,_128UL>::operator[]
                         ((array<float,_128UL> *)local_238,(long)m._4_4_ % 0x80);
      *(float *)psi_it = fVar1 * *pvVar3;
      psi_it = (iterator)((long)psi_it + 4);
    }
    if (m._4_4_ < 0x100) {
      pVar4 = max_delta_element(this,(long)m._4_4_);
      *(long *)input_it.index_ = pVar4.first;
      max_el.first._0_4_ = pVar4.second;
      pvVar3 = std::array<float,_128UL>::operator[]
                         ((array<float,_128UL> *)local_238,(long)m._4_4_ % 0x80);
      *pvVar3 = pVar4.second;
      input_it.index_ = input_it.index_ + 8;
    }
  }
  return;
}

Assistant:

void
    calculate_transition(gsl::span<T const, N> input) noexcept
    {
        auto delta_it = std::begin(delta);
        auto psi_it = std::begin(psi);
        auto input_it = std::cbegin(input);

        std::array<T, radius> temp;

        for (auto i = 0; i < 3 * radius; i++) {
            auto m = i % radius;
            if (i >= radius) {
                *(delta_it++) = *(input_it++) * temp[m];
            }
            if (i < N) {
                auto max_el = max_delta_element(i);
                *(psi_it++) = max_el.first; // index
                temp[m] = max_el.second; // value
            }
        }
    }